

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O3

DirectionCone * RandomCone(DirectionCone *__return_storage_ptr__,RNG *rng)

{
  undefined8 uVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM5 [16];
  float local_38;
  float local_28;
  undefined1 extraout_var [60];
  
  uVar3 = rng->state * 0x5851f42d4c957f2d + rng->inc;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = rng->state;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar3;
  auVar10 = vpunpcklqdq_avx(auVar13,auVar9);
  auVar6 = vpsrlvq_avx2(auVar10,_DAT_0054e5c0);
  auVar9 = vpsrlvq_avx2(auVar10,_DAT_0054e5b0);
  auVar10 = vpsrlq_avx(auVar10,0x3b);
  auVar10 = vpshufd_avx(auVar10,0xe8);
  rng->state = uVar3 * 0x5851f42d4c957f2d + rng->inc;
  auVar6 = vpshufd_avx(auVar9 ^ auVar6,0xe8);
  auVar10 = vprorvd_avx512vl(auVar6,auVar10);
  auVar6 = vcvtudq2ps_avx512vl(auVar10);
  auVar10._8_4_ = 0x2f800000;
  auVar10._0_8_ = 0x2f8000002f800000;
  auVar10._12_4_ = 0x2f800000;
  auVar7 = vmulps_avx512vl(auVar6,auVar10);
  auVar6._8_4_ = 0x3f7fffff;
  auVar6._0_8_ = 0x3f7fffff3f7fffff;
  auVar6._12_4_ = 0x3f7fffff;
  uVar3 = vcmpps_avx512vl(auVar7,auVar6,1);
  auVar10 = vmovshdup_avx(auVar7);
  bVar4 = (byte)(uVar3 >> 1);
  auVar9 = vfmadd132ss_fma(ZEXT416((uint)(bVar4 & 1) * auVar10._0_4_ +
                                   (uint)!(bool)(bVar4 & 1) * 0x3f7fffff),
                           SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
  auVar10 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar9,auVar9);
  auVar10 = vmaxss_avx(auVar10,ZEXT816(0) << 0x20);
  auVar6 = vsqrtss_avx(auVar10,auVar10);
  fVar5 = (float)((uint)((byte)uVar3 & 1) * (int)(auVar7._0_4_ * 6.2831855) +
                 (uint)!(bool)((byte)uVar3 & 1) * 0x40c90fda);
  fVar8 = cosf(fVar5);
  auVar12._0_4_ = sinf(fVar5);
  auVar12._4_60_ = extraout_var;
  uVar3 = rng->state;
  auVar7._4_4_ = extraout_XMM0_Db;
  auVar7._0_4_ = fVar8;
  auVar7._8_4_ = extraout_XMM0_Dc;
  auVar7._12_4_ = extraout_XMM0_Dd;
  local_28 = auVar9._0_4_;
  uVar2 = (uint)(uVar3 >> 0x2d) ^ (uint)(uVar3 >> 0x1b);
  bVar4 = (byte)(uVar3 >> 0x3b);
  auVar9 = vcvtusi2ss_avx512f(in_XMM5,uVar2 >> bVar4 | uVar2 << 0x20 - bVar4);
  auVar10 = vinsertps_avx(auVar7,auVar12._0_16_,0x10);
  local_38 = auVar6._0_4_;
  rng->state = uVar3 * 0x5851f42d4c957f2d + rng->inc;
  auVar11._0_4_ = auVar10._0_4_ * local_38;
  auVar11._4_4_ = auVar10._4_4_ * local_38;
  auVar11._8_4_ = auVar10._8_4_ * local_38;
  auVar11._12_4_ = auVar10._12_4_ * local_38;
  auVar10 = vminss_avx(ZEXT416((uint)(auVar9._0_4_ * 2.3283064e-10)),SUB6416(ZEXT464(0x3f7fffff),0))
  ;
  auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar10,ZEXT416(0xbf800000));
  auVar14._0_4_ = auVar11._0_4_ * auVar11._0_4_;
  auVar14._4_4_ = auVar11._4_4_ * auVar11._4_4_;
  auVar14._8_4_ = auVar11._8_4_ * auVar11._8_4_;
  auVar14._12_4_ = auVar11._12_4_ * auVar11._12_4_;
  auVar10 = vhaddps_avx(auVar14,auVar14);
  auVar10 = ZEXT416((uint)(local_28 * local_28 + auVar10._0_4_));
  auVar10 = vsqrtss_avx(auVar10,auVar10);
  fVar5 = auVar10._0_4_;
  auVar15._4_4_ = fVar5;
  auVar15._0_4_ = fVar5;
  auVar15._8_4_ = fVar5;
  auVar15._12_4_ = fVar5;
  auVar10 = vdivps_avx(auVar11,auVar15);
  uVar1 = vmovlps_avx(auVar10);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = local_28 / fVar5;
  __return_storage_ptr__->cosTheta = auVar6._0_4_;
  __return_storage_ptr__->empty = false;
  return __return_storage_ptr__;
}

Assistant:

DirectionCone RandomCone(RNG &rng) {
    Vector3f w = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
    return DirectionCone(w, -1 + 2 * rng.Uniform<Float>());
}